

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O3

int nv_compar(void *lhs,void *rhs)

{
  int iVar1;
  
  iVar1 = bytes_compar(*lhs,*(size_t *)((long)lhs + 0x10),*rhs,*(size_t *)((long)rhs + 0x10));
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = bytes_compar(*(uint8_t **)((long)lhs + 8),*(size_t *)((long)lhs + 0x18),
                       *(uint8_t **)((long)rhs + 8),*(size_t *)((long)rhs + 0x18));
  return iVar1;
}

Assistant:

static int nv_compar(const void *lhs, const void *rhs) {
  const nghttp2_nv *a = (const nghttp2_nv *)lhs;
  const nghttp2_nv *b = (const nghttp2_nv *)rhs;
  int rv;

  rv = bytes_compar(a->name, a->namelen, b->name, b->namelen);

  if (rv == 0) {
    return bytes_compar(a->value, a->valuelen, b->value, b->valuelen);
  }

  return rv;
}